

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

int envy_bios_parse_mem_train(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  ushort uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  envy_bios_mem_train_entry *peVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long local_48;
  
  uVar1 = (bios->mem).train.offset;
  if (uVar1 == 0) {
    iVar12 = 0;
  }
  else {
    iVar3 = bios_u8(bios,(uint)uVar1,&(bios->mem).train.version);
    iVar4 = bios_u8(bios,(bios->mem).train.offset + 1,&(bios->mem).train.hlen);
    iVar5 = bios_u8(bios,(bios->mem).train.offset + 2,&(bios->mem).train.rlen);
    iVar6 = bios_u8(bios,(bios->mem).train.offset + 3,&(bios->mem).train.subentrylen);
    res = &(bios->mem).train.subentries;
    iVar7 = bios_u8(bios,(bios->mem).train.offset + 4,res);
    res_00 = &(bios->mem).train.entriesnum;
    iVar8 = bios_u8(bios,(bios->mem).train.offset + 5,res_00);
    iVar12 = -0xe;
    if (iVar8 == 0 && (iVar7 == 0 && ((iVar6 == 0 && iVar5 == 0) && (iVar4 == 0 && iVar3 == 0)))) {
      bios_u16(bios,(bios->mem).train.offset + 6,&(bios->mem).train.mclk);
      envy_bios_block(bios,(uint)(bios->mem).train.offset,
                      (uint)(bios->mem).train.entriesnum * (uint)(bios->mem).train.rlen +
                      (uint)(bios->mem).train.hlen,"MEM TRAIN",-1);
      peVar11 = (envy_bios_mem_train_entry *)calloc((ulong)(bios->mem).train.entriesnum,0xc);
      (bios->mem).train.entries = peVar11;
      if (peVar11 == (envy_bios_mem_train_entry *)0x0) {
        iVar12 = -0xc;
      }
      else {
        local_48 = 3;
        uVar14 = 0;
        do {
          if (*res_00 <= uVar14) {
            (bios->mem).train.valid = '\x01';
            return 0;
          }
          peVar11 = (bios->mem).train.entries;
          uVar9 = (int)uVar14 *
                  ((uint)(bios->mem).train.subentrylen * (uint)(bios->mem).train.subentries +
                  (uint)(bios->mem).train.rlen) +
                  (uint)(bios->mem).train.hlen + (uint)(bios->mem).train.offset;
          peVar11[uVar14].offset = (uint16_t)uVar9;
          uVar9 = bios_u8(bios,uVar9 & 0xffff,&peVar11[uVar14].u00);
          bVar2 = (bios->mem).train.subentries;
          if (8 < bVar2) {
            *res = '\b';
            fprintf(_stderr,"Error when parsing mem train: subentries = %d > %zu\n",8,8);
            break;
          }
          for (uVar13 = 0; uVar13 < bVar2; uVar13 = uVar13 + 1) {
            uVar10 = bios_u8(bios,(int)uVar13 + (uint)peVar11[uVar14].offset + 1,
                             peVar11->subentry + uVar13 + local_48 + -3);
            uVar9 = uVar9 | uVar10;
            bVar2 = (bios->mem).train.subentries;
          }
          uVar14 = uVar14 + 1;
          local_48 = local_48 + 0xc;
        } while (uVar9 == 0);
        iVar12 = -0xe;
      }
    }
  }
  return iVar12;
}

Assistant:

int
envy_bios_parse_mem_train (struct envy_bios *bios) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	if (!mt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mt->offset, &mt->version);
	err |= bios_u8(bios, mt->offset+1, &mt->hlen);
	err |= bios_u8(bios, mt->offset+2, &mt->rlen);
	err |= bios_u8(bios, mt->offset+3, &mt->subentrylen);
	err |= bios_u8(bios, mt->offset+4, &mt->subentries);
	err |= bios_u8(bios, mt->offset+5, &mt->entriesnum);
	if (err)
		return -EFAULT;
	bios_u16(bios, mt->offset+6, &mt->mclk);

	envy_bios_block(bios, mt->offset, mt->hlen + mt->rlen * mt->entriesnum, "MEM TRAIN", -1);
	mt->entries = calloc(mt->entriesnum, sizeof *mt->entries);
	if (!mt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mt->entriesnum; i++) {
		struct envy_bios_mem_train_entry *entry = &mt->entries[i];
		entry->offset = mt->offset + mt->hlen + ((mt->rlen + mt->subentries * mt->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->u00);
		if (mt->subentries > sizeof(entry->subentry)) {
			mt->subentries = sizeof(entry->subentry);
			ENVY_BIOS_ERR("Error when parsing mem train: subentries = %d > %zu\n", mt->subentries, sizeof(entry->subentry));
			return -EFAULT;
		}
		int j;
		for (j = 0; j < mt->subentries; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &entry->subentry[j]);
		}
		if (err)
			return -EFAULT;
	}
	mt->valid = 1;
	return 0;
}